

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isBilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths,Vec2 *xBounds,
               Vec2 *yBounds,float cmpReference,float result,bool isFixedPointDepth)

{
  CmpResultSet CVar1;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  uint uVar5;
  byte bVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  byte bVar11;
  uint uVar12;
  float fVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  BVec4 cmpTrue;
  Vec4 refVal;
  byte local_d0 [3];
  bool local_cd;
  float local_cc;
  undefined1 local_c8 [16];
  float local_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  Vec2 *local_88;
  Vec2 *local_80;
  float local_78;
  float local_68 [14];
  
  local_a8._0_4_ = *(undefined4 *)(prec + 0x18);
  local_ac = depths->m_data[1];
  local_cc = depths->m_data[2];
  local_98 = CONCAT44(local_98._4_4_,depths->m_data[3]);
  local_88 = xBounds;
  local_80 = yBounds;
  local_78 = result;
  local_c8._0_4_ = cmpReference;
  CVar1 = execCompare(compareMode,depths->m_data[0],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar2 = execCompare(compareMode,local_ac,(float)local_c8._0_4_,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar3 = execCompare(compareMode,local_cc,(float)local_c8._0_4_,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar4 = execCompare(compareMode,(float)local_98,(float)local_c8._0_4_,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  if ((int)local_a8._0_4_ < 1) {
    uVar14 = 0x3f800000;
    if (((((ushort)CVar1 & 1) == 0) && (((ushort)CVar2 & 1) == 0)) && (((ushort)CVar3 & 1) == 0)) {
      if (((ushort)CVar4 & 1) == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0x3f800000;
      }
    }
    local_c8 = ZEXT416(uVar14);
    uVar14 = 0;
    if ((((ushort)((ushort)CVar3 | (ushort)CVar2 | (ushort)CVar1) >> 8 & 1) == 0) &&
       (((ushort)CVar4 >> 8 & 1) == 0)) {
      uVar14 = 0x3f800000;
    }
    local_a8 = ZEXT416(uVar14);
    fVar13 = TexVerifierUtil::computeFixedPointError(*(int *)(prec + 0x20));
    bVar11 = -(local_78 <= (float)local_c8._0_4_ + fVar13) &
             -((float)local_a8._0_4_ - fVar13 <= local_78);
  }
  else {
    uVar5 = (ushort)CVar4 >> 5 & 8 |
            (ushort)CVar3 >> 6 & 4 | (ushort)CVar2 >> 7 & 2 | (ushort)CVar1 >> 8 & 1;
    local_98 = *(undefined8 *)local_88->m_data;
    uStack_90 = 0;
    local_c8._0_4_ = local_80->m_data[0];
    local_a8 = ZEXT416((uint)local_80->m_data[1]);
    local_cc = TexVerifierUtil::computeFixedPointError(*(int *)(prec + 0x18));
    fVar13 = TexVerifierUtil::computeFixedPointError(*(int *)(prec + 0x20));
    fVar16 = 1.0 - (float)local_c8._0_4_;
    fVar15 = 1.0 - (float)local_a8._0_4_;
    uVar14 = 0;
    bVar11 = true;
    do {
      if (((((ushort)CVar1 & 1) + ((ushort)CVar2 & 1) * 2 + ((ushort)CVar3 & 1) * 4 +
            ((ushort)CVar4 & 1) * 8 ^ uVar5) & uVar14 ^ uVar5) == 0xf) {
        bVar6 = (byte)uVar14;
        local_d0[0] = bVar6 & 1;
        local_d0[1] = bVar6 >> 1 & 1;
        local_d0[2] = bVar6 >> 2 & 1;
        local_cd = 7 < uVar14;
        local_68[8] = 1.0;
        local_68[9] = 1.0;
        local_68[10] = 1.0;
        local_68[0xb] = 1.0;
        local_68[4] = 0.0;
        local_68[5] = 0.0;
        local_68[6] = 0.0;
        local_68[7] = 0.0;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        local_68[3] = 0.0;
        lVar9 = 0;
        pfVar7 = local_68 + 8;
        pfVar8 = local_68 + 4;
        do {
          pfVar10 = pfVar7;
          if (local_d0[lVar9] == 0) {
            pfVar10 = pfVar8;
          }
          local_68[lVar9] = *pfVar10;
          lVar9 = lVar9 + 1;
          pfVar8 = pfVar8 + 1;
          pfVar7 = pfVar7 + 1;
        } while (lVar9 != 4);
        fVar19 = local_68[0] * (1.0 - (float)local_98);
        local_68[0] = local_68[0] * (1.0 - local_98._4_4_);
        fVar20 = local_68[2] * (1.0 - (float)local_98);
        local_68[2] = local_68[2] * (1.0 - local_98._4_4_);
        fVar17 = local_68[3] * (float)local_98 * (float)local_c8._0_4_ +
                 fVar20 * (float)local_c8._0_4_ +
                 fVar19 * fVar16 + fVar16 * local_68[1] * (float)local_98;
        fVar18 = local_68[3] * local_98._4_4_ * (float)local_c8._0_4_ +
                 local_68[2] * (float)local_c8._0_4_ +
                 local_68[0] * fVar16 + local_68[1] * local_98._4_4_ * fVar16;
        fVar19 = local_68[3] * (float)local_98 * (float)local_a8._0_4_ +
                 fVar20 * (float)local_a8._0_4_ +
                 fVar19 * fVar15 + fVar15 * local_68[1] * (float)local_98;
        fVar20 = local_68[3] * local_98._4_4_ * (float)local_a8._0_4_ +
                 local_68[2] * (float)local_a8._0_4_ +
                 local_68[0] * fVar15 + fVar15 * local_68[1] * local_98._4_4_;
        fVar21 = (float)(~-(uint)(fVar19 <= fVar20) & (uint)fVar20 |
                        -(uint)(fVar19 <= fVar20) & (uint)fVar19);
        uVar12 = -(uint)(fVar18 <= fVar21);
        fVar21 = (float)(uVar12 & (uint)fVar18 | ~uVar12 & (uint)fVar21);
        uVar12 = -(uint)(fVar17 <= fVar21);
        if (((float)(uVar12 & (uint)fVar17 | ~uVar12 & (uint)fVar21) - (fVar13 + local_cc) <=
             local_78) &&
           (fVar19 = (float)(~-(uint)(fVar20 <= fVar19) & (uint)fVar20 |
                            (uint)fVar19 & -(uint)(fVar20 <= fVar19)),
           uVar12 = -(uint)(fVar19 <= fVar18),
           fVar19 = (float)(uVar12 & (uint)fVar18 | ~uVar12 & (uint)fVar19),
           uVar12 = -(uint)(fVar19 <= fVar17),
           local_78 <= (float)(uVar12 & (uint)fVar17 | ~uVar12 & (uint)fVar19) + fVar13 + local_cc))
        break;
      }
      bVar11 = uVar14 < 0xf;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x10);
  }
  return (bool)(bVar11 & 1);
}

Assistant:

static bool isBilinearCompareValid (const Sampler::CompareMode	compareMode,
									const TexComparePrecision&	prec,
									const Vec4&					depths,
									const Vec2&					xBounds,
									const Vec2&					yBounds,
									const float					cmpReference,
									const float					result,
									const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isBilinearPCFCompareValid(compareMode, prec, depths, xBounds, yBounds, cmpReference, result, isFixedPointDepth);
	else
		return isBilinearAnyCompareValid(compareMode, prec, depths, cmpReference, result, isFixedPointDepth);
}